

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFPageObjectHelper.cc
# Opt level: O2

QPDFPageObjectHelper * __thiscall
QPDFPageObjectHelper::shallowCopyPage
          (QPDFPageObjectHelper *__return_storage_ptr__,QPDFPageObjectHelper *this)

{
  QPDFObjectHandle *oh;
  BaseHandle *pBVar1;
  QPDFObjectHandle new_page;
  allocator<char> local_71;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> local_70;
  QPDFObjectHandle local_60;
  string local_50;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> local_30;
  
  pBVar1 = &(this->super_QPDFObjectHelper).super_BaseHandle;
  std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_70,(__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)pBVar1);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"QPDFPageObjectHelper::shallowCopyPage called with a direct object"
             ,&local_71);
  oh = (QPDFObjectHandle *)QPDFObjectHandle::getQPDF((QPDFObjectHandle *)&local_70,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_70._M_refcount);
  std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_70,(__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)pBVar1);
  QPDFObjectHandle::shallowCopy((QPDFObjectHandle *)&local_50);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_70._M_refcount);
  std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_30,(__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&local_50);
  QPDF::makeIndirectObject((QPDF *)&local_60,oh);
  QPDFPageObjectHelper(__return_storage_ptr__,&local_60);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_60.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_30._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_50._M_string_length);
  return __return_storage_ptr__;
}

Assistant:

QPDFPageObjectHelper
QPDFPageObjectHelper::shallowCopyPage()
{
    QPDF& qpdf = oh().getQPDF("QPDFPageObjectHelper::shallowCopyPage called with a direct object");
    QPDFObjectHandle new_page = oh().shallowCopy();
    return {qpdf.makeIndirectObject(new_page)};
}